

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

string * process_with_aes(string *__return_storage_ptr__,string *key,bool encrypt,string *data,
                         size_t outlength,uint repetitions,uchar *iv,size_t iv_length)

{
  uint uVar1;
  uchar *key_00;
  bool bVar2;
  Pl_Buffer buffer;
  Pl_AES_PDF aes;
  string local_130;
  Pl_Buffer local_110;
  Pl_AES_PDF local_d8;
  
  Pl_Buffer::Pl_Buffer(&local_110,"buffer",(Pipeline *)0x0);
  key_00 = QUtil::unsigned_char_pointer(key);
  local_130._M_dataplus._M_p = (pointer)key->_M_string_length;
  uVar1 = QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::convert
                    ((unsigned_long *)&local_130);
  Pl_AES_PDF::Pl_AES_PDF(&local_d8,"aes",&local_110.super_Pipeline,encrypt,key_00,(ulong)uVar1);
  if (iv == (uchar *)0x0) {
    Pl_AES_PDF::useZeroIV(&local_d8);
  }
  else {
    Pl_AES_PDF::setIV(&local_d8,iv,iv_length);
  }
  Pl_AES_PDF::disablePadding(&local_d8);
  while (bVar2 = repetitions != 0, repetitions = repetitions - 1, bVar2) {
    Pipeline::writeString(&local_d8.super_Pipeline,data);
  }
  Pl_AES_PDF::finish(&local_d8);
  if (outlength == 0) {
    Pl_Buffer::getString_abi_cxx11_(__return_storage_ptr__,&local_110);
  }
  else {
    Pl_Buffer::getString_abi_cxx11_(&local_130,&local_110);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
  }
  Pl_AES_PDF::~Pl_AES_PDF(&local_d8);
  Pl_Buffer::~Pl_Buffer(&local_110);
  return __return_storage_ptr__;
}

Assistant:

static std::string
process_with_aes(
    std::string const& key,
    bool encrypt,
    std::string const& data,
    size_t outlength = 0,
    unsigned int repetitions = 1,
    unsigned char const* iv = nullptr,
    size_t iv_length = 0)
{
    Pl_Buffer buffer("buffer");
    Pl_AES_PDF aes(
        "aes", &buffer, encrypt, QUtil::unsigned_char_pointer(key), QIntC::to_uint(key.length()));
    if (iv) {
        aes.setIV(iv, iv_length);
    } else {
        aes.useZeroIV();
    }
    aes.disablePadding();
    for (unsigned int i = 0; i < repetitions; ++i) {
        aes.writeString(data);
    }
    aes.finish();
    if (outlength == 0) {
        return buffer.getString();
    } else {
        return buffer.getString().substr(0, outlength);
    }
}